

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

Array<capnp::Schema> * __thiscall
capnp::SchemaLoader::getAllLoaded(Array<capnp::Schema> *__return_storage_ptr__,SchemaLoader *this)

{
  Locked<const_kj::Own<capnp::SchemaLoader::Impl>_> local_20;
  
  kj::_::Mutex::lock((Mutex *)this,SHARED);
  local_20.ptr = &(this->impl).value;
  local_20.mutex = (Mutex *)this;
  Impl::getAllLoaded(__return_storage_ptr__,(this->impl).value.ptr);
  kj::Locked<const_kj::Own<capnp::SchemaLoader::Impl>_>::~Locked(&local_20);
  return __return_storage_ptr__;
}

Assistant:

kj::Array<Schema> SchemaLoader::getAllLoaded() const {
  return impl.lockShared()->get()->getAllLoaded();
}